

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t exr_encoding_run(exr_const_context_t ctxt,int part_index,exr_encode_pipeline_t *encode)

{
  long lVar1;
  undefined8 *puVar2;
  size_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_coding_channel_info_t *encc;
  int c;
  exr_const_priv_part_t part;
  uint64_t packed_bytes;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  size_t *sz;
  uint in_stack_ffffffffffffffd8;
  exr_result_t eVar4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar4 = 0;
  sz = (size_t *)0x0;
  if (in_RDI == (char *)0x0) {
    eVar4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock((exr_const_context_t)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
      eVar4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RDX == (size_t *)0x0) {
        if (*in_RDI == '\x01') {
          internal_exr_unlock((exr_const_context_t)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        }
        eVar4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else if (((char *)in_RDX[3] == in_RDI) && (*(int *)((long)in_RDX + 0x14) == in_ESI)) {
        if (((*(int *)(lVar1 + 4) == 2) || (*(int *)(lVar1 + 4) == 3)) &&
           ((in_RDX[0x10] == 0 ||
            (in_RDX[0x11] != (long)(int)in_RDX[6] * (long)*(int *)((long)in_RDX + 0x2c) * 4)))) {
          if (*in_RDI == '\x01') {
            internal_exr_unlock((exr_const_context_t)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          }
          eVar4 = (**(code **)(in_RDI + 0x40))
                            (in_RDI,3,"Invalid / missing sample count table for deep data");
        }
        else {
          for (iVar3 = 0; iVar3 < (short)in_RDX[2]; iVar3 = iVar3 + 1) {
            puVar2 = (undefined8 *)(in_RDX[1] + (long)iVar3 * 0x30);
            if (*(int *)(puVar2 + 1) != 0) {
              if (*(int *)((long)puVar2 + 0xc) == 0) {
                if (*in_RDI == '\x01') {
                  internal_exr_unlock((exr_const_context_t)CONCAT44(iVar3,in_stack_ffffffffffffffc0)
                                     );
                }
                eVar4 = (**(code **)(in_RDI + 0x48))(in_RDI,3,"Unexpected 0-width chunk to encode");
                return eVar4;
              }
              if (puVar2[5] == 0) {
                if (*in_RDI == '\x01') {
                  internal_exr_unlock((exr_const_context_t)CONCAT44(iVar3,in_stack_ffffffffffffffc0)
                                     );
                }
                eVar4 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,3,
                                   "Missing channel data pointer - must encode all channels");
                return eVar4;
              }
              if ((*(short *)((long)puVar2 + 0x1c) != 2) && (*(short *)((long)puVar2 + 0x1c) != 4))
              {
                if (*in_RDI == '\x01') {
                  internal_exr_unlock((exr_const_context_t)CONCAT44(iVar3,in_stack_ffffffffffffffc0)
                                     );
                }
                eVar4 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,3,
                                   "Invalid / unsupported output bytes per element (%d) for channel %c (%s)"
                                   ,(int)*(short *)((long)puVar2 + 0x1c),iVar3,*puVar2);
                return eVar4;
              }
              if (((*(short *)((long)puVar2 + 0x1e) != 1) && (*(short *)((long)puVar2 + 0x1e) != 2))
                 && (*(short *)((long)puVar2 + 0x1e) != 0)) {
                if (*in_RDI == '\x01') {
                  internal_exr_unlock((exr_const_context_t)CONCAT44(iVar3,in_stack_ffffffffffffffc0)
                                     );
                }
                eVar4 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,3,
                                   "Invalid / unsupported output data type (%d) for channel %c (%s)"
                                   ,*(undefined2 *)((long)puVar2 + 0x1e),iVar3,*puVar2);
                return eVar4;
              }
              sz = (size_t *)
                   ((long)*(int *)(puVar2 + 1) * (long)*(int *)((long)puVar2 + 0xc) *
                    (long)*(char *)((long)puVar2 + 0x19) + (long)sz);
            }
          }
          in_RDX[0xe] = 0;
          if (in_RDX[0x1e] == 0) {
            if ((in_RDX[0xd] == 0) || (sz != (size_t *)in_RDX[0x16])) {
              if (*in_RDI == '\x01') {
                internal_exr_unlock((exr_const_context_t)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
              }
              eVar4 = (**(code **)(in_RDI + 0x40))
                                (in_RDI,3,
                                 "Encode pipeline has no packing function declared and packed buffer is null or appears to need packing"
                                );
              return eVar4;
            }
          }
          else if ((sz != (size_t *)0x0) &&
                  (eVar4 = internal_encode_alloc_buffer
                                     ((exr_encode_pipeline_t *)
                                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                      (exr_transcoding_pipeline_buffer_id_t)((ulong)in_RDI >> 0x20),
                                      (void **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                                      CONCAT44(eVar4,in_stack_ffffffffffffffd8)), eVar4 == 0)) {
            eVar4 = (*(code *)in_RDX[0x1e])(in_RDX);
          }
          if (*in_RDI == '\x01') {
            internal_exr_unlock((exr_const_context_t)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
          }
          if (((*(int *)(lVar1 + 4) == 2) || (*(int *)(lVar1 + 4) == 3)) && (in_RDX[0x10] != 0)) {
            priv_from_native32((void *)in_RDX[0x10],(int)in_RDX[6] * *(int *)((long)in_RDX + 0x2c));
          }
          if (eVar4 == 0) {
            if ((in_RDX[0x1f] == 0) || (in_RDX[0xe] == 0)) {
              internal_encode_free_buffer
                        ((exr_encode_pipeline_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (exr_transcoding_pipeline_buffer_id_t)((ulong)in_RDX >> 0x20),
                         (void **)(ulong)in_stack_ffffffffffffffd8,sz);
              internal_encode_free_buffer
                        ((exr_encode_pipeline_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (exr_transcoding_pipeline_buffer_id_t)((ulong)in_RDX >> 0x20),
                         (void **)CONCAT44(eVar4,in_stack_ffffffffffffffd8),sz);
              in_RDX[0x15] = in_RDX[0xd];
              in_RDX[0x16] = in_RDX[0xe];
              in_RDX[0x17] = 0;
              in_RDX[0x12] = in_RDX[0x10];
              in_RDX[0x14] = 0;
              in_RDX[0x13] = (long)(int)in_RDX[6] * (long)*(int *)((long)in_RDX + 0x2c) * 4;
            }
            else {
              eVar4 = (*(code *)in_RDX[0x1f])(in_RDX);
            }
          }
          if ((eVar4 == 0) && (in_RDX[0x20] != 0)) {
            eVar4 = (*(code *)in_RDX[0x20])(in_RDX);
          }
          if ((eVar4 == 0) && (in_RDX[0x21] != 0)) {
            eVar4 = (*(code *)in_RDX[0x21])(in_RDX);
          }
          if (((*(int *)(lVar1 + 4) == 2) || (*(int *)(lVar1 + 4) == 3)) && (in_RDX[0x10] != 0)) {
            priv_to_native32((void *)in_RDX[0x10],(int)in_RDX[6] * *(int *)((long)in_RDX + 0x2c));
          }
        }
      }
      else {
        if (*in_RDI == '\x01') {
          internal_exr_unlock((exr_const_context_t)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        }
        eVar4 = (**(code **)(in_RDI + 0x40))
                          (in_RDI,3,
                           "Invalid request for encoding update from different context / part");
      }
    }
  }
  return eVar4;
}

Assistant:

exr_result_t
exr_encoding_run (
    exr_const_context_t ctxt, int part_index, exr_encode_pipeline_t* encode)
{
    exr_result_t rv           = EXR_ERR_SUCCESS;
    uint64_t     packed_bytes = 0;
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (!encode)
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));
    if (encode->context != ctxt || encode->part_index != part_index)
        return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for encoding update from different context / part"));

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (encode->sample_count_table == NULL ||
            encode->sample_count_alloc_size !=
                (((size_t) encode->chunk.width) *
                 ((size_t) encode->chunk.height) * sizeof (int32_t)))
        {
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / missing sample count table for deep data"));
        }
    }

    for (int c = 0; c < encode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* encc = (encode->channels + c);

        if (encc->height == 0) continue;

        if (encc->width == 0)
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Unexpected 0-width chunk to encode"));
        if (!encc->encode_from_ptr)
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Missing channel data pointer - must encode all channels"));

        /*
         * if a user specifies a bad pixel stride / line stride
         * we can't know this realistically, and they may want to
         * use 0 to cause things to collapse for testing purposes
         * so only test the values we can
         */
        if (encc->user_bytes_per_element != 2 &&
            encc->user_bytes_per_element != 4)
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output bytes per element (%d) for channel %c (%s)",
                (int) encc->user_bytes_per_element,
                c,
                encc->channel_name));

        if (encc->user_data_type != (uint16_t) (EXR_PIXEL_HALF) &&
            encc->user_data_type != (uint16_t) (EXR_PIXEL_FLOAT) &&
            encc->user_data_type != (uint16_t) (EXR_PIXEL_UINT))
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output data type (%d) for channel %c (%s)",
                (int) encc->user_data_type,
                c,
                encc->channel_name));

        packed_bytes +=
            ((uint64_t) (encc->height) * (uint64_t) (encc->width) *
             (uint64_t) (encc->bytes_per_element));
    }

    encode->packed_bytes = 0;
    if (encode->convert_and_pack_fn)
    {
        if (packed_bytes > 0)
        {
            rv = internal_encode_alloc_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED,
                &(encode->packed_buffer),
                &(encode->packed_alloc_size),
                packed_bytes);

            if (rv == EXR_ERR_SUCCESS)
                rv = encode->convert_and_pack_fn (encode);
        }
    }
    else if (!encode->packed_buffer || packed_bytes != encode->compressed_bytes)
    {
        return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Encode pipeline has no packing function declared and packed buffer is null or appears to need packing"));
    }
    if (ctxt->mode == EXR_CONTEXT_WRITE) internal_exr_unlock (ctxt);

    if ((part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED) &&
        encode->sample_count_table != NULL)
    {
        priv_from_native32 (
            encode->sample_count_table,
            encode->chunk.width * encode->chunk.height);
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        if (encode->compress_fn && encode->packed_bytes > 0)
        {
            rv = encode->compress_fn (encode);
        }
        else
        {
            internal_encode_free_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_COMPRESSED,
                &(encode->compressed_buffer),
                &(encode->compressed_alloc_size));

            internal_encode_free_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                &(encode->packed_sample_count_table),
                &(encode->packed_sample_count_alloc_size));

            encode->compressed_buffer     = encode->packed_buffer;
            encode->compressed_bytes      = encode->packed_bytes;
            encode->compressed_alloc_size = 0;

            encode->packed_sample_count_table      = encode->sample_count_table;
            encode->packed_sample_count_alloc_size = 0;
            encode->packed_sample_count_bytes =
                (((size_t) encode->chunk.width) *
                 ((size_t) encode->chunk.height) * sizeof (int32_t));
        }
    }

    if (rv == EXR_ERR_SUCCESS && encode->yield_until_ready_fn)
        rv = encode->yield_until_ready_fn (encode);

    if (rv == EXR_ERR_SUCCESS && encode->write_fn)
        rv = encode->write_fn (encode);

    if ((part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED) &&
        encode->sample_count_table != NULL)
    {
        priv_to_native32 (
            encode->sample_count_table,
            encode->chunk.width * encode->chunk.height);
    }

    return rv;
}